

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QHttp2ConfigurationPrivate>::reset
          (QSharedDataPointer<QHttp2ConfigurationPrivate> *this,QHttp2ConfigurationPrivate *ptr)

{
  bool bVar1;
  QHttp2ConfigurationPrivate *pQVar2;
  QHttp2ConfigurationPrivate *in_RSI;
  totally_ordered_wrapper<QHttp2ConfigurationPrivate_*> *in_RDI;
  long in_FS_OFFSET;
  QHttp2ConfigurationPrivate *old;
  totally_ordered_wrapper<QHttp2ConfigurationPrivate_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QHttp2ConfigurationPrivate_*> local_18;
  totally_ordered_wrapper<QHttp2ConfigurationPrivate_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::get(in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QHttp2ConfigurationPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2b18a8);
    }
    Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::totally_ordered_wrapper
              (&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate*>,Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QHttp2ConfigurationPrivate_*> *)0x2b18c6);
    pQVar2 = Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::get(&local_10);
    if (((pQVar2 != (QHttp2ConfigurationPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2b18ec), !bVar1)) &&
       (pQVar2 != (QHttp2ConfigurationPrivate *)0x0)) {
      operator_delete(pQVar2,0x18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }